

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall
MutableBuffer::MutableBuffer(MutableBuffer *this,size_t _reserved,EndianessMode _endianess)

{
  void *pvVar1;
  EndianessMode _endianess_local;
  size_t _reserved_local;
  MutableBuffer *this_local;
  
  Buffer::Buffer(&this->super_Buffer,_endianess);
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__MutableBuffer_001a5b98;
  this->reserved = _reserved;
  this->growth = 1000;
  if (this->reserved != 0) {
    pvVar1 = malloc(this->reserved);
    (this->super_Buffer).data = pvVar1;
    (this->super_Buffer).read = (uint8_t *)(this->super_Buffer).data;
  }
  (this->super_Buffer).size = 0;
  (this->super_Buffer).owned = true;
  return;
}

Assistant:

MutableBuffer::MutableBuffer(size_t _reserved, EndianessMode _endianess)
  : Buffer(_endianess)
  , reserved(_reserved)
  , growth(1000) {
  if (reserved > 0) {
    data = ::malloc(reserved);
    read = reinterpret_cast<uint8_t*>(data);
  }
  size = 0;
  owned = true;
}